

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

DdNode * Llb_NonlinCreateCube1(Llb_Mgr_t *p,Llb_Prt_t *pPart)

{
  DdManager *pDVar1;
  abctime aVar2;
  Llb_Var_t *pLVar3;
  Vec_Int_t *p_00;
  int iVar4;
  DdNode *n;
  DdNode *pDVar5;
  int i;
  
  pDVar1 = p->dd;
  aVar2 = pDVar1->TimeStop;
  pDVar1->TimeStop = 0;
  n = Cudd_ReadOne(pDVar1);
  Cudd_Ref(n);
  i = 0;
  while( true ) {
    if (pPart->vVars->nSize <= i) {
      Cudd_Deref(n);
      p->dd->TimeStop = aVar2;
      return n;
    }
    iVar4 = Vec_IntEntry(pPart->vVars,i);
    pLVar3 = p->pVars[iVar4];
    p_00 = pLVar3->vParts;
    iVar4 = p_00->nSize;
    if (iVar4 < 1) break;
    pDVar5 = n;
    if (iVar4 == 1) {
      iVar4 = Vec_IntEntry(p_00,0);
      if (iVar4 != pPart->iPart) {
        __assert_fail("Vec_IntEntry(pVar->vParts, 0) == pPart->iPart",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb3Image.c"
                      ,0x98,"DdNode *Llb_NonlinCreateCube1(Llb_Mgr_t *, Llb_Prt_t *)");
      }
      pDVar1 = p->dd;
      pDVar5 = Cudd_bddIthVar(pDVar1,pLVar3->iVar);
      pDVar5 = Cudd_bddAnd(pDVar1,n,pDVar5);
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(p->dd,n);
    }
    i = i + 1;
    n = pDVar5;
  }
  __assert_fail("Vec_IntSize(pVar->vParts) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb3Image.c"
                ,0x95,"DdNode *Llb_NonlinCreateCube1(Llb_Mgr_t *, Llb_Prt_t *)");
}

Assistant:

DdNode * Llb_NonlinCreateCube1( Llb_Mgr_t * p, Llb_Prt_t * pPart )
{
    DdNode * bCube, * bTemp;
    Llb_Var_t * pVar;
    int i;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bCube = Cudd_ReadOne(p->dd);   Cudd_Ref( bCube );
    Llb_PartForEachVar( p, pPart, pVar, i )
    {
        assert( Vec_IntSize(pVar->vParts) > 0 );
        if ( Vec_IntSize(pVar->vParts) != 1 )
            continue;
        assert( Vec_IntEntry(pVar->vParts, 0) == pPart->iPart );
        bCube = Cudd_bddAnd( p->dd, bTemp = bCube, Cudd_bddIthVar(p->dd, pVar->iVar) );    Cudd_Ref( bCube );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Cudd_Deref( bCube );
    p->dd->TimeStop = TimeStop;
    return bCube;
}